

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O1

bool __thiscall
cmBuildCommand::MainSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  cmCommand *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  cmGlobalGenerator *this_01;
  ostream *poVar5;
  pointer pbVar6;
  string *psVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  string configuration;
  string target;
  string project_name;
  string makecommand;
  string local_238;
  string local_218;
  cmCommand *local_1f8;
  string local_1f0;
  string local_1d0;
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  if (local_1b0 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"requires at least one argument naming a CMake variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar10 = false;
  }
  else {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    iVar8 = 0;
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar10 = (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0x21;
    local_1f8 = &this->super_cmCommand;
    if (!bVar10) {
      uVar4 = 1;
      uVar9 = 2;
      do {
        iVar3 = std::__cxx11::string::compare((char *)(pbVar6 + uVar4));
        if (iVar3 == 0) {
          iVar8 = 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar4));
          if (iVar3 == 0) {
            iVar8 = 2;
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar4));
            if (iVar3 == 0) {
              iVar8 = 3;
            }
            else {
              psVar7 = &local_218;
              if (iVar8 != 1) {
                if (iVar8 == 3) {
                  psVar7 = &local_1f0;
                }
                else {
                  if (iVar8 != 2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"unknown argument \"",0x12);
                    pcVar1 = local_1f8;
                    pbVar6 = (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1a8,pbVar6[uVar4]._M_dataplus._M_p,
                                        pbVar6[uVar4]._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(pcVar1,&local_238);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    std::ios_base::~ios_base(local_138);
                    goto LAB_0029b189;
                  }
                  psVar7 = &local_1d0;
                }
              }
              iVar8 = 0;
              std::__cxx11::string::_M_assign((string *)psVar7);
            }
          }
        }
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar4 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
        bVar10 = uVar4 <= uVar9;
        bVar2 = uVar9 < uVar4;
        uVar4 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2);
    }
    pcVar1 = local_1f8;
    if (local_218._M_string_length == 0) {
      cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&local_218);
    }
    if (local_218._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,0x596bdb);
    }
    if (local_1d0._M_string_length != 0) {
      this_00 = pcVar1->Makefile;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Ignoring PROJECT_NAME option because it has no effect.","");
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    this_01 = cmMakefile::GetGlobalGenerator(pcVar1->Makefile);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    bVar2 = cmMakefile::IgnoreErrorsCMP0061(pcVar1->Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_1a8,this_01,&local_1f0,&local_218,&local_238,bVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    cmMakefile::AddDefinition(pcVar1->Makefile,local_1b0,(char *)local_1a8._0_8_);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
LAB_0029b189:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                               local_1d0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar10;
}

Assistant:

bool cmBuildCommand::MainSignature(std::vector<std::string> const& args)
{
  if (args.empty()) {
    this->SetError("requires at least one argument naming a CMake variable");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  // Parse remaining arguments.
  std::string configuration;
  std::string project_name;
  std::string target;
  enum Doing
  {
    DoingNone,
    DoingConfiguration,
    DoingProjectName,
    DoingTarget
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "CONFIGURATION") {
      doing = DoingConfiguration;
    } else if (args[i] == "PROJECT_NAME") {
      doing = DoingProjectName;
    } else if (args[i] == "TARGET") {
      doing = DoingTarget;
    } else if (doing == DoingConfiguration) {
      doing = DoingNone;
      configuration = args[i];
    } else if (doing == DoingProjectName) {
      doing = DoingNone;
      project_name = args[i];
    } else if (doing == DoingTarget) {
      doing = DoingNone;
      target = args[i];
    } else {
      std::ostringstream e;
      e << "unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  // If null/empty CONFIGURATION argument, cmake --build uses 'Debug'
  // in the currently implemented multi-configuration global generators...
  // so we put this code here to end up with the same default configuration
  // as the original 2-arg build_command signature:
  //
  if (configuration.empty()) {
    cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configuration);
  }
  if (configuration.empty()) {
    configuration = "Release";
  }

  if (!project_name.empty()) {
    this->Makefile->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "Ignoring PROJECT_NAME option because it has no effect.");
  }

  std::string makecommand =
    this->Makefile->GetGlobalGenerator()->GenerateCMakeBuildCommand(
      target, configuration, "", this->Makefile->IgnoreErrorsCMP0061());

  this->Makefile->AddDefinition(variable, makecommand.c_str());

  return true;
}